

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdx86_decoder.c
# Opt level: O3

NDSTATUS NdDecodeWithContext(INSTRUX *Instrux,ND_UINT8 *Code,ND_SIZET Size,ND_CONTEXT *Context)

{
  ND_OPERAND *pNVar1;
  ND_UINT8 *Code_00;
  byte *pbVar2;
  ND_UINT32 *pNVar3;
  ushort *puVar4;
  ulong uVar5;
  sbyte sVar6;
  sbyte sVar7;
  ushort uVar8;
  ushort uVar9;
  ND_UINT8 NVar10;
  byte bVar11;
  undefined2 uVar12;
  uint uVar13;
  uint uVar14;
  NDSTATUS NVar15;
  uint uVar16;
  ND_REG_TYPE NVar17;
  ND_SIZET NVar18;
  ND_TABLE_EX_M *pNVar19;
  ND_TABLE_OPCODE *pNVar20;
  ulong uVar21;
  ulong uVar22;
  anon_union_8_5_2338f8ca_for__INSTRUX_88 aVar23;
  ND_UINT64 NVar24;
  ushort uVar25;
  uint uVar26;
  int iVar27;
  uint uVar28;
  byte bVar29;
  byte bVar30;
  anon_struct_4_18_63b3064b_for_Exs aVar31;
  ND_REG_SIZE VsibRegSize;
  ushort uVar32;
  ND_SIZET NVar33;
  byte bVar34;
  ND_UINT8 *pNVar35;
  uint uVar36;
  ND_OPERAND *Operand;
  ulong uVar37;
  ND_TABLE_OPCODE *pNVar38;
  ND_UINT8 RelOffsetSize;
  bool bVar39;
  bool bVar40;
  char local_50;
  ulong local_48;
  undefined1 local_34;
  
  if ((Context == (ND_CONTEXT *)0x0 || Size == 0) ||
      (Code == (ND_UINT8 *)0x0 || Instrux == (INSTRUX *)0x0)) {
    return 0x80000100;
  }
  uVar26 = (uint)*(undefined8 *)Context;
  if (0x2000 < (uVar26 & 0xf000)) {
    return 0x80000100;
  }
  if (2 < (uVar26 & 0xf)) {
    return 0x80000100;
  }
  if (0x20 < (uVar26 & 0xf0)) {
    return 0x80000100;
  }
  if ((Context->Options & 2) == 0) {
    nd_memset(Instrux,0,0x1e8);
    uVar26 = (uint)*(undefined8 *)Context;
  }
  uVar36 = *(uint *)Instrux;
  uVar26 = uVar26 & 3;
  *(uint *)Instrux = uVar36 & 0xfffffffc | uVar26;
  uVar36 = (uVar36 & 0xfffffff0 | uVar26) + (*(uint *)Context >> 4 & 3) * 4;
  *(uint *)Instrux = uVar36;
  uVar13 = *(uint *)Context >> 4 & 0x30;
  *(uint *)Instrux = uVar36 & 0xffffffcf | uVar13;
  uVar14 = (*(uint *)Context & 0xf000) << 0x10;
  *(uint *)Instrux = uVar36 & 0xfffffcf | uVar13 | uVar14;
  uVar14 = uVar36 & 0xff0ffcf | uVar13 | uVar14;
  Instrux->FeatMode = Context->field_0x2;
  *(uint *)Instrux = uVar14;
  NVar18 = 0xf;
  if (Size < 0xf) {
    NVar18 = Size;
  }
  NVar33 = 0;
  do {
    Instrux->InstructionBytes[NVar33] = Code[NVar33];
    NVar33 = NVar33 + 1;
  } while (NVar18 != NVar33);
  Code_00 = Instrux->InstructionBytes;
  if (""[Instrux->InstructionBytes[0]] != '\0') {
    bVar29 = 0;
    while( true ) {
      if (Size <= bVar29) {
        return 0x80000001;
      }
      bVar34 = Code_00[bVar29];
      NVar10 = ""[bVar34];
      if (NVar10 != '\x01') break;
      if (bVar34 < 0xf0) {
        uVar37 = (ulong)(bVar34 - 0x2e);
        if (bVar34 - 0x2e < 0x3a) {
          if ((0xc0000000010101U >> (uVar37 & 0x3f) & 1) == 0) {
            if (uVar37 == 0x38) {
              uVar36 = 0x20;
            }
            else {
              if (uVar37 != 0x39) goto LAB_0015b010;
              uVar36 = 0x40;
            }
            goto LAB_0015af43;
          }
        }
        else {
LAB_0015b010:
          if (bVar34 != 0x26) goto LAB_0015b101;
        }
        if ((uVar26 != 2) || ((bVar34 & 0xfe) == 100)) {
LAB_0015af39:
          Instrux->Seg = bVar34;
LAB_0015af3d:
          uVar36 = 0x400;
          goto LAB_0015af43;
        }
        if ((Instrux->Seg & 0xfe) != 100 && bVar34 == 0x3e) {
          Instrux->Seg = '>';
          goto LAB_0015af3d;
        }
        uVar36 = Instrux->Seg - 0x3e;
        if ((0x27 < uVar36) || ((0xc000000001U >> ((ulong)uVar36 & 0x3f) & 1) == 0))
        goto LAB_0015af39;
      }
      else {
        if (bVar34 == 0xf0) {
          uVar36 = 0x80;
        }
        else if (bVar34 == 0xf2) {
          Instrux->Rep = 0xf2;
          uVar36 = 0x100;
        }
        else {
          if (bVar34 != 0xf3) goto LAB_0015b101;
          Instrux->Rep = 0xf3;
          uVar36 = 0x200;
        }
LAB_0015af43:
        *(uint *)&Instrux->field_0x5 = *(uint *)&Instrux->field_0x5 | uVar36;
      }
      if ((*(uint *)&Instrux->field_0x5 & 1) != 0) {
        *(uint *)&Instrux->field_0x5 = *(uint *)&Instrux->field_0x5 & 0xfffffffe;
        (Instrux->field_73).Rex = (ND_REX)0x0;
        Instrux->Exs = (anon_struct_4_18_63b3064b_for_Exs)((uint)Instrux->Exs & 0xfffffff0);
      }
      bVar29 = bVar29 + 1;
      bVar34 = Instrux->Length + 1;
      Instrux->Length = bVar34;
      if (0xf < bVar34) {
        return 0x80000003;
      }
    }
    if (NVar10 != '\0') {
      if ((uVar26 == 2) && (NVar10 == '\x03')) {
        Instrux->field_0x5 = Instrux->field_0x5 | 1;
        *(byte *)&Instrux->field_73 = bVar34;
        halt_baddata();
      }
      if (NVar10 == '\x02') {
        if (bVar34 < 0xc4) {
          if (bVar34 == 0x62) {
            NVar15 = NdFetchEvex(Instrux,Code_00,bVar29,Size);
          }
          else {
            if (bVar34 != 0x8f) {
              return 0x80000101;
            }
            NVar15 = NdFetchXop(Instrux,Code_00,bVar29,Size);
          }
        }
        else if (bVar34 == 0xc4) {
          NVar15 = NdFetchVex3(Instrux,Code_00,bVar29,Size);
        }
        else if (bVar34 == 0xc5) {
          NVar15 = NdFetchVex2(Instrux,Code_00,bVar29,Size);
        }
        else {
          if (bVar34 != 0xd5) {
            return 0x80000101;
          }
          NVar15 = NdFetchRex2(Instrux,Code_00,bVar29,Size);
        }
        if ((int)NVar15 < 0) {
          return NVar15;
        }
      }
    }
LAB_0015b101:
    uVar26 = Instrux->Length & 0xf;
    *(ulong *)&Instrux->field_0xc =
         (ulong)(uVar26 << 8) |
         *(ulong *)&Instrux->field_0xc & 0xfffff0fffffff0ff | (ulong)uVar26 << 0x28;
    uVar14 = *(uint *)Instrux;
  }
  switch(uVar14 & 3) {
  case 0:
    uVar26 = (uVar14 & 0xfffffc3f | *(uint *)&Instrux->field_0x5 & 0x40) +
             (*(uint *)&Instrux->field_0x5 & 0x20) * 8;
    break;
  case 1:
    uVar26 = (uVar14 & 0xfffffc3f | *(uint *)&Instrux->field_0x5 & 0x40) +
             (*(uint *)&Instrux->field_0x5 & 0x20) * 8 ^ 0x140;
    break;
  case 2:
    iVar27 = 0x200;
    if (((uint)Instrux->Exs & 1) == 0) {
      iVar27 = (~*(uint *)&Instrux->field_0x5 & 0x20) << 3;
    }
    uVar26 = iVar27 + 0x40 +
             (uVar14 & 0xfffffc3f | (uint)((*(uint *)&Instrux->field_0x5 & 0x40) == 0) << 6);
    break;
  case 3:
LAB_0015ad8b:
    return 0x80000101;
  }
  *(uint *)Instrux = uVar26;
  switch(uVar26 >> 0x10 & 0xf) {
  case 0:
    if (*(char *)((long)&Instrux->field_73 + 1) < '\0') {
      pNVar38 = &gLegacyMap_opcode_0f_opcode;
    }
    else {
      pNVar38 = &gLegacyMap_opcode;
    }
    goto LAB_0015b215;
  case 1:
    pNVar19 = &gXopMap_mmmmm;
    break;
  case 2:
    pNVar19 = &gVexMap_mmmmm;
    break;
  case 3:
    pNVar19 = &gEvexMap_mmmmm;
    break;
  default:
    goto LAB_0015ad8b;
  }
  pNVar38 = (ND_TABLE_OPCODE *)pNVar19->Table[(uint)Instrux->Exs >> 9 & 0x1f];
  if (pNVar38 != (ND_TABLE_OPCODE *)0x0) {
LAB_0015b215:
    local_48 = 0;
    bVar40 = false;
    bVar39 = false;
    do {
      switch(pNVar38->Type) {
      case 0:
        puVar4 = (ushort *)pNVar38->Table[0];
        if (puVar4 == (ushort *)0x0) {
          return 0x80000002;
        }
        if (((*(ulong *)(puVar4 + 0x14) & 1) != 0) &&
           ((*(uint *)&Instrux->field_0x5 >> 0xb & 1) == 0)) {
          bVar29 = Instrux->Length;
          if (((uint)*(ulong *)(puVar4 + 0x14) >> 0x11 & 1) == 0) {
            NVar15 = NdFetchModrmSibDisplacement(Instrux,Code_00,bVar29,Size);
            if ((int)NVar15 < 0) {
              return NVar15;
            }
          }
          else {
            if (Size <= bVar29) {
              return 0x80000001;
            }
            *(uint *)&Instrux->field_0x5 = *(uint *)&Instrux->field_0x5 | 0x800;
            Instrux->ModRm = *(ND_MODRM *)(Instrux->InstructionBytes + bVar29);
            *(ushort *)&Instrux->field_0x14 =
                 *(ushort *)&Instrux->field_0x14 & 0xfff | (ushort)bVar29 << 0xc;
            Instrux->Length = bVar29 + 1;
            if (0xf < (byte)(bVar29 + 1)) {
              return 0x80000003;
            }
          }
        }
        uVar37 = *(ulong *)&Instrux->field_0xc;
        uVar26 = (uint)uVar37 >> 0xc & 0xf;
        Instrux->field_99 =
             *(anon_union_1_2_d70d35b6_for__INSTRUX_116 *)
              (Instrux->InstructionBytes + (ulong)uVar26 + 0xf);
        if ((Instrux->Attributes & 0x800) == 0) {
          NVar10 = (char)uVar26 + (char)(uVar37 >> 0x28);
        }
        else {
          NVar10 = Instrux->Length;
        }
        uVar21 = (ulong)(NVar10 - 1 & 0xf) << 0x2c;
        *(ulong *)&Instrux->field_0xc = uVar37 & 0xffff0fffffffffff | uVar21;
        Instrux->Mnemonic = gMnemonics[puVar4[2]];
        uVar5 = *(ulong *)(puVar4 + 0x14);
        Instrux->Attributes = uVar5;
        Instrux->Instruction = (uint)*puVar4;
        Instrux->Category = (uint)(byte)puVar4[1];
        Instrux->IsaSet = (uint)*(byte *)((long)puVar4 + 3);
        uVar26 = *(uint *)(puVar4 + 0x10) & *(uint *)(puVar4 + 0xe);
        (Instrux->FlagsAccess).Undefined.Raw = uVar26;
        (Instrux->FlagsAccess).Tested = *(ND_RFLAGS *)(puVar4 + 10);
        (Instrux->FlagsAccess).Modified = *(ND_RFLAGS *)(puVar4 + 0xc);
        (Instrux->FlagsAccess).Set.Raw = *(uint *)(puVar4 + 0xe) ^ uVar26;
        (Instrux->FlagsAccess).Cleared.Raw = uVar26 ^ *(uint *)(puVar4 + 0x10);
        Instrux->CpuidFlag = *(ND_CPUID_FLAG *)(puVar4 + 0x18);
        Instrux->ValidModes = *(ND_VALID_MODES *)(puVar4 + 4);
        Instrux->ValidPrefixes = *(ND_VALID_PREFIXES *)(puVar4 + 3);
        bVar29 = (byte)puVar4[6];
        (Instrux->ValidDecorators).Raw = bVar29;
        Instrux->FpuFlagsAccess = *(ND_FPU_FLAGS *)(puVar4 + 8);
        Instrux->SimdExceptions = *(ND_SIMD_EXCEPTIONS *)(puVar4 + 9);
        Instrux->ExceptionType = *(ND_UINT8 *)((long)puVar4 + 0xf);
        Instrux->TupleType = (ND_UINT8)puVar4[7];
        uVar26 = *(uint *)Instrux;
        uVar36 = (*(byte *)((long)puVar4 + 0x11) & 0xf) << 0x18;
        *(uint *)Instrux = uVar26 & 0xf0ffffff | uVar36;
        aVar31 = Instrux->Exs;
        uVar14 = (uint)uVar5;
        if (((uVar26 & 3) != 2) && ((uVar5 & 0x40000000) != 0)) {
          aVar31 = (anon_struct_4_18_63b3064b_for_Exs)((uint)aVar31 & 0xfffffffe);
          Instrux->Exs = aVar31;
        }
        bVar39 = (uVar5 & 2) != 0;
        if (bVar39) {
          bVar40 = (uVar5 & 4) == 0 && (uVar26 & 0xf0000000) != 0x20000000;
        }
        else {
          bVar40 = (uVar5 & 4) == 0;
        }
        uVar13 = *(uint *)&Instrux->field_0x5;
        if (((uVar13 & 0x20) == 0) || (bVar34 = 1, (uVar14 >> 0x13 & 1) == 0 && (int)uVar13 < 0)) {
          if (((uint)aVar31 & 0x180) == 0x80) {
            bVar34 = (byte)(uVar5 >> 0x24) & 1;
          }
          else {
            bVar34 = 0;
          }
        }
        switch(uVar26 & 3) {
        case 0:
          if ((uVar5 & 8) != 0) {
            return 0x80000009;
          }
          break;
        case 1:
          if ((uVar5 & 8) != 0) {
            return 0x80000009;
          }
          bVar34 = bVar34 ^ 1;
          break;
        case 2:
          if ((uVar5 & 0x10) != 0) {
            return 0x80000009;
          }
          uVar16 = (uint)(bVar34 ^ 1) << 10;
          if (bVar39 && (uVar26 & 0xf0000000) != 0x20000000) {
            uVar16 = 0x800;
          }
          if (((uVar14 >> 10 & 1) == 0 & aVar31._0_1_) != 0) {
            uVar16 = 0x800;
          }
          uVar28 = 0x800;
          if (bVar34 != 0) {
            uVar28 = uVar16;
          }
          if (bVar40) {
            uVar28 = uVar16;
          }
          uVar16 = 0x80;
          if ((uVar14 >> 0x1c & 1) == 0) {
            uVar16 = uVar26 & 0xc0;
          }
          uVar28 = uVar16 | uVar26 & 0xf0fff33f | uVar36 | uVar28;
          goto LAB_0015b90f;
        case 3:
          goto LAB_0015ad8b;
        }
        uVar28 = uVar26 & 0xf0fff3ff | uVar36 | (uint)bVar34 << 10;
LAB_0015b90f:
        *(uint *)Instrux = uVar28;
        *(ulong *)&Instrux->field_0xc =
             uVar37 & 0xffff0ffffffffff0 | uVar21 |
             (ulong)(*(byte *)((long)&NdParseOperand_wszLut + (ulong)(uVar28 >> 10 & 3)) & 0xf);
        if ((uVar13 & 0x10) != 0) {
          if ((uVar28 & 0xf000000) == 0) {
            if (((uint)Instrux->field_73 & 0x40000) == 0) {
              if ((Instrux->ModRm).ModRm < 0xc0) {
                return 0x80000046;
              }
              if (((uint)aVar31 & 0x200000) == 0) {
                return 0x80000046;
              }
LAB_0015d49f:
              if ((bVar29 & 1) == 0) {
                if ((bVar29 & 2) == 0) {
                  if ((uVar14 >> 0x1d & 1) == 0) {
                    return 0x80000035;
                  }
                  uVar13 = uVar13 | 0x40000000;
                }
                else {
                  uVar13 = uVar13 | 0x4000000;
                }
LAB_0015d528:
                *(uint *)&Instrux->field_0x5 = uVar13;
              }
              else {
                uVar13 = uVar13 | 0x6000000;
                *(uint *)&Instrux->field_0x5 = uVar13;
                *(ushort *)&Instrux->field_0x9 =
                     *(ushort *)&Instrux->field_0x9 & 0x9fff | (ushort)((uint)aVar31 >> 1) & 0x6000;
              }
            }
            else if (((uint)aVar31 >> 0x15 & 1) != 0) {
              if (0xbf < (Instrux->ModRm).ModRm) goto LAB_0015d49f;
              if ((bVar29 & 0x10) == 0) {
                return 0x80000039;
              }
              uVar13 = uVar13 | 0x400000;
              goto LAB_0015d528;
            }
            if (((uint)aVar31 & 0x3800000) == 0) {
              if ((uVar14 >> 0xd & 1) != 0) {
                return 0x80000034;
              }
            }
            else {
              if ((bVar29 & 8) == 0) {
                return 0x80000033;
              }
              uVar13 = uVar13 | 0x800000;
              *(uint *)&Instrux->field_0x5 = uVar13;
            }
            if (((uint)aVar31 >> 0x16 & 1) != 0) {
              if ((bVar29 & 4) == 0) {
                return 0x80000036;
              }
              if ((uVar13 >> 0x17 & 1) == 0) {
                return 0x80000038;
              }
              uVar13 = uVar13 | 0x1000000;
              *(uint *)&Instrux->field_0x5 = uVar13;
            }
            uVar26 = 0x3ffffff;
            if (((uint)uVar37 & 0xf0000) == 0x10000 && (uVar13 >> 0xd & 1) != 0) {
              uVar13 = uVar13 | 0x200000;
              uVar26 = 0x3ffffff;
              goto LAB_0015d5a3;
            }
          }
          else {
            if ((Instrux->FeatMode & 0x10) == 0) {
              return 0x80000002;
            }
            if ((*(byte *)((long)&Instrux->field_73 + 3) & (&DAT_001f70b0)[uVar28 >> 0x18 & 0xf]) !=
                0) {
              return 0x80000045;
            }
            if ((((uint)Instrux->field_73 & 0x40000) == 0) && (0xbf < (Instrux->ModRm).ModRm)) {
              return 0x80000046;
            }
            if ((bVar29 & 0x20) != 0) {
              uVar13 = (uVar13 & 0xf7ffffff) + ((uint)aVar31 & 0x4000000) * 2;
              *(uint *)&Instrux->field_0x5 = uVar13;
            }
            if ((bVar29 & 0x40) != 0) {
              uVar13 = (uVar13 & 0xefffffff) + ((uint)aVar31 & 0x8000000) * 2;
              *(uint *)&Instrux->field_0x5 = uVar13;
            }
            uVar26 = 0xfc1f3fff;
            if ((char)bVar29 < '\0') {
              uVar13 = (uVar13 & 0xdfffffff) + ((uint)aVar31 & 0x4000000) * 8;
              uVar26 = 0xfc1f3fff;
LAB_0015d5a3:
              *(uint *)&Instrux->field_0x5 = uVar13;
            }
          }
          Instrux->Exs = (anon_struct_4_18_63b3064b_for_Exs)((uint)aVar31 & uVar26);
        }
        if (((uVar14 >> 0x12 & 1) != 0) && (NVar15 = NdGetVectorLength(Instrux), (int)NVar15 < 0)) {
          return NVar15;
        }
        bVar29 = *(byte *)((long)puVar4 + 0xd);
        bVar34 = bVar29 & 0xf | bVar29 << 4;
        Instrux->field_0x39 = bVar34;
        if ((Context->Options & 1) == 0) {
          bVar34 = (*(byte *)((long)puVar4 + 0xd) >> 4) + bVar29 & 0xf | bVar29 << 4;
          Instrux->field_0x39 = bVar34;
        }
        if ((bVar34 & 0xf) == 0) goto LAB_0015d36d;
        pNVar1 = Instrux->Operands;
        uVar37 = 0;
        goto LAB_0015b994;
      case 1:
        NVar10 = Instrux->Length;
        goto LAB_0015b3df;
      case 2:
        NVar10 = Instrux->Length;
        if ((Instrux->field_0x6 & 8) == 0) {
          NVar15 = NdFetchModrmSibDisplacement(Instrux,Code_00,NVar10,Size);
          if ((int)NVar15 < 0) {
            return NVar15;
          }
          NVar10 = Instrux->Length;
        }
LAB_0015b3df:
        NVar15 = NdFetchOpcode(Instrux,Code_00,NVar10,Size);
        if ((int)NVar15 < 0) {
          return NVar15;
        }
        uVar37 = (ulong)Instrux->OpCodeBytes[local_48];
        local_48 = (ulong)((int)local_48 + 1);
        break;
      case 3:
        if (((Instrux->field_0x6 & 8) == 0) &&
           (NVar15 = NdFetchModrmSibDisplacement(Instrux,Code_00,Instrux->Length,Size),
           (int)NVar15 < 0)) {
          return NVar15;
        }
        pNVar20 = *(ND_TABLE_OPCODE **)
                   ((long)pNVar38->Table + (ulong)((Instrux->ModRm).ModRm & 0x38));
        goto LAB_0015b590;
      case 4:
        if (((Instrux->field_0x6 & 8) == 0) &&
           (NVar15 = NdFetchModrmSibDisplacement(Instrux,Code_00,Instrux->Length,Size),
           (int)NVar15 < 0)) {
          return NVar15;
        }
        uVar37 = (ulong)(0xbf < (Instrux->ModRm).ModRm);
        break;
      case 5:
        if (((Instrux->field_0x6 & 8) == 0) &&
           (NVar15 = NdFetchModrmSibDisplacement(Instrux,Code_00,Instrux->Length,Size),
           (int)NVar15 < 0)) {
          return NVar15;
        }
        uVar37 = (ulong)((Instrux->ModRm).ModRm & 7);
        break;
      case 6:
        if (Instrux->Rep == 0xf2 && !bVar39) {
          pNVar20 = (ND_TABLE_OPCODE *)pNVar38->Table[3];
          *(ushort *)&Instrux->field_0x9 = *(ushort *)&Instrux->field_0x9 | 1;
          bVar39 = true;
        }
        else if (Instrux->Rep == 0xf3 && !bVar40) {
          pNVar20 = (ND_TABLE_OPCODE *)pNVar38->Table[2];
          *(ushort *)&Instrux->field_0x9 = *(ushort *)&Instrux->field_0x9 | 2;
          bVar40 = true;
        }
        else {
          if ((*(uint *)&Instrux->field_0x5 & 0x20) == 0) goto LAB_0015b474;
          pNVar20 = (ND_TABLE_OPCODE *)pNVar38->Table[1];
          *(uint *)&Instrux->field_0x5 = *(uint *)&Instrux->field_0x5 | 0x80000000;
        }
        goto LAB_0015b590;
      case 7:
        uVar37 = (ulong)(*(uint *)Instrux & 3);
        goto LAB_0015b466;
      case 8:
        if (((*(uint *)Instrux & 3) != 2) ||
           (((pNVar20 = (ND_TABLE_OPCODE *)pNVar38->Table[4], pNVar20 == (ND_TABLE_OPCODE *)0x0 ||
             (((Instrux->field_0x5 & 0x20) != 0 && (((uint)Instrux->Exs & 1) == 0)))) &&
            (pNVar20 = (ND_TABLE_OPCODE *)pNVar38->Table[5], pNVar20 == (ND_TABLE_OPCODE *)0x0)))) {
          uVar37 = (ulong)(*(uint *)Instrux >> 8 & 3);
          goto LAB_0015b466;
        }
        goto LAB_0015b590;
      case 9:
        uVar37 = (ulong)(*(uint *)Instrux >> 6 & 3);
LAB_0015b466:
        pNVar20 = (ND_TABLE_OPCODE *)pNVar38->Table[uVar37 + 1];
LAB_0015b46b:
        if (pNVar20 == (ND_TABLE_OPCODE *)0x0) {
LAB_0015b474:
          pNVar20 = (ND_TABLE_OPCODE *)pNVar38->Table[0];
        }
        goto LAB_0015b590;
      case 10:
        if ((((((((uint)Instrux->Exs & 0x48) != 0) &&
               (pNVar20 = (ND_TABLE_OPCODE *)pNVar38->Table[1], pNVar20 != (ND_TABLE_OPCODE *)0x0))
              || ((((uint)Instrux->Exs & 1) != 0 &&
                  (pNVar20 = (ND_TABLE_OPCODE *)pNVar38->Table[2], pNVar20 != (ND_TABLE_OPCODE *)0x0
                  )))) ||
             (((*(uint *)Instrux & 3) == 2 &&
              (pNVar20 = (ND_TABLE_OPCODE *)pNVar38->Table[3], pNVar20 != (ND_TABLE_OPCODE *)0x0))))
            || ((Instrux->Rep != '\0' &&
                (((Instrux->Rep == 0xf3 &&
                  (pNVar20 = (ND_TABLE_OPCODE *)pNVar38->Table[4], pNVar20 != (ND_TABLE_OPCODE *)0x0
                  )) || (pNVar20 = (ND_TABLE_OPCODE *)pNVar38->Table[5],
                        pNVar20 != (ND_TABLE_OPCODE *)0x0)))))) ||
           ((((*(uint *)&Instrux->field_0x5 >> 0xb & 1) != 0 && (*(uint *)Instrux & 3) == 2 &&
             (((Instrux->ModRm).ModRm & 199) == 5)) &&
            (pNVar20 = (ND_TABLE_OPCODE *)pNVar38->Table[6], pNVar20 != (ND_TABLE_OPCODE *)0x0))))
        goto LAB_0015b590;
        if ((*(uint *)&Instrux->field_0x5 & 2) != 0) {
          pNVar20 = (ND_TABLE_OPCODE *)pNVar38->Table[7];
          if (pNVar20 != (ND_TABLE_OPCODE *)0x0) goto LAB_0015b590;
          if (((uint)Instrux->field_73 & 0x800) != 0) {
            pNVar20 = (ND_TABLE_OPCODE *)pNVar38->Table[8];
            goto LAB_0015b46b;
          }
        }
        goto LAB_0015b474;
      case 0xb:
        pNVar20 = (ND_TABLE_OPCODE *)pNVar38->Table[*(uint *)Instrux >> 0x1c];
        goto LAB_0015b46b;
      case 0xc:
        pNVar20 = (ND_TABLE_OPCODE *)pNVar38->Table[1];
        if ((((pNVar20 == (ND_TABLE_OPCODE *)0x0) || ((Instrux->FeatMode & 1) == 0)) &&
            ((pNVar20 = (ND_TABLE_OPCODE *)pNVar38->Table[2], pNVar20 == (ND_TABLE_OPCODE *)0x0 ||
             ((Instrux->FeatMode & 2) == 0)))) &&
           (((pNVar20 = (ND_TABLE_OPCODE *)pNVar38->Table[3], pNVar20 == (ND_TABLE_OPCODE *)0x0 ||
             ((Instrux->FeatMode & 4) == 0)) &&
            ((pNVar20 = (ND_TABLE_OPCODE *)pNVar38->Table[4], pNVar20 == (ND_TABLE_OPCODE *)0x0 ||
             ((Instrux->FeatMode & 8) == 0)))))) goto LAB_0015b474;
        goto LAB_0015b590;
      case 0xd:
        uVar12 = 0x509;
        goto LAB_0015b451;
      case 0xe:
        uVar12 = 0x207;
        goto LAB_0015b451;
      case 0xf:
        aVar31 = Instrux->Exs;
        if (((*(uint *)&Instrux->field_0x5 & 0x10) == 0) ||
           (((uint)aVar31 >> 0x15 & 1) == 0 || ((uint)aVar31 & 0x3e00) == 0x800)) {
          uVar37 = (ulong)((uint)aVar31 >> 0xe & 3);
          break;
        }
        if (((*(uint *)&Instrux->field_0x5 >> 0xb & 1) == 0) &&
           (NVar15 = NdFetchModrmSibDisplacement(Instrux,Code_00,Instrux->Length,Size),
           (int)NVar15 < 0)) {
          return NVar15;
        }
        if ((Instrux->ModRm).ModRm < 0xc0) {
          uVar12 = 0x20e;
          goto LAB_0015b451;
        }
        pNVar20 = (ND_TABLE_OPCODE *)pNVar38->Table[2];
        if (pNVar20 == (ND_TABLE_OPCODE *)0x0) {
          pNVar20 = (ND_TABLE_OPCODE *)pNVar38->Table[1];
          goto LAB_0015b46b;
        }
        goto LAB_0015b590;
      case 0x10:
switchD_0015b24d_caseD_10:
        uVar37 = (ulong)((uint)Instrux->Exs & 1);
        break;
      case 0x11:
        if (((undefined1  [488])*Instrux & (undefined1  [488])0x3) == (undefined1  [488])0x2)
        goto switchD_0015b24d_caseD_10;
        uVar37 = 0;
        break;
      case 0x12:
        uVar12 = 0x11a;
        goto LAB_0015b451;
      case 0x13:
        uVar12 = 0x11b;
LAB_0015b451:
        uVar37 = (ulong)((uint)Instrux->Exs >> (sbyte)uVar12 &
                        (1 << (sbyte)((ushort)uVar12 >> 8)) - 1U);
        break;
      case 0x14:
        uVar37 = (ulong)((uint)Instrux->Exs >> 0x1c);
        break;
      default:
        return 0x80000200;
      }
      pNVar20 = (ND_TABLE_OPCODE *)pNVar38->Table[uVar37];
LAB_0015b590:
      pNVar38 = pNVar20;
    } while (pNVar20 != (ND_TABLE_OPCODE *)0x0);
  }
LAB_0015ad8b:
  return 0x80000002;
LAB_0015b994:
  aVar31 = Instrux->Exs;
  bVar34 = 1;
  bVar29 = aVar31._0_1_;
  if (((uint)aVar31 & 1) != 0) {
    bVar34 = (*(byte *)((long)&Instrux->Attributes + 1) & 4) >> 2;
  }
  uVar5 = *(ulong *)(puVar4 + uVar37 * 4 + 0x1c);
  NVar10 = Instrux->Length;
  Instrux->Operands[uVar37].Flags.Flags = (ND_UINT8)(uVar5 >> 0x10);
  bVar11 = (byte)(uVar5 >> 0x18);
  Instrux->Operands[uVar37].Access.Access = bVar11;
  *(byte *)(pNVar1 + uVar37) = *(byte *)(pNVar1 + uVar37) & 0xf | 0xc0;
  uVar26 = (uint)(uVar5 >> 8) & 0xff;
  switch(uVar26) {
  case 1:
  case 0x33:
    VsibRegSize = 0;
    local_34 = 0;
    uVar14 = 0;
    uVar36 = 0;
    goto LAB_0015bdb4;
  case 2:
    bVar30 = *(byte *)Instrux >> 6;
    goto LAB_0015bc57;
  case 3:
    bVar30 = *(byte *)Instrux >> 4 & 3;
LAB_0015bc57:
    uVar36 = 2 << bVar30;
    break;
  case 4:
    if ((*(uint *)Instrux & 2) != 0) {
      return 0x80000101;
    }
    uVar21 = (ulong)(*(uint *)Instrux >> 10 & 3);
    pNVar35 = "\x04\b";
    goto LAB_0015ba22;
  case 5:
    switch(*(uint *)Instrux & 3) {
    case 0:
      uVar36 = 2 - ((Instrux->field_0x5 & 0x20) == 0);
      break;
    case 1:
      bVar39 = (Instrux->field_0x5 & 0x20) == 0;
      uVar36 = bVar39 + 2 + (uint)bVar39;
      break;
    case 2:
      goto switchD_0015ba0f_caseD_9;
    case 3:
      goto LAB_0015ad8b;
    }
    break;
  case 6:
    uVar36 = 1;
    break;
  case 7:
  case 0x14:
  case 0x1f:
    uVar36 = 2;
    break;
  case 8:
  case 0x15:
  case 0x1e:
    uVar36 = 4;
    break;
  case 9:
  case 0x16:
  case 0x1d:
switchD_0015ba0f_caseD_9:
    uVar36 = 8;
    break;
  case 10:
    uVar36 = 0x10;
    break;
  case 0xb:
    uVar36 = 0x20;
    break;
  case 0xc:
  case 0x2b:
    uVar36 = 0x40;
    break;
  case 0xd:
    uVar12 = 0x20a;
    goto LAB_0015bc77;
  case 0xe:
    uVar36 = *(uint *)Instrux >> 10;
    goto LAB_0015bced;
  case 0xf:
    uVar36 = *(uint *)Instrux;
LAB_0015bced:
    uVar21 = (ulong)(uVar36 & 3);
    pNVar35 = "\x04\x04\b\x02\x04\x04\x04\x06\n\x06\x06\n\b\b\x10";
    goto LAB_0015ba22;
  case 0x10:
    uVar12 = 0x20a;
    pNVar35 = "\x02\x04\x04\x04\x06\n\x06\x06\n\b\b\x10";
    goto LAB_0015ba1d;
  case 0x11:
    uVar36 = *(uint *)Instrux;
    pNVar35 = "\x06\x06\n\b\b\x10";
    goto LAB_0015bce0;
  case 0x12:
    uVar12 = 0x20a;
    pNVar35 = "\x04\x06\n\x06\x06\n\b\b\x10";
    goto LAB_0015ba1d;
  case 0x13:
  case 0x17:
    uVar36 = 10;
    break;
  case 0x18:
    bVar30 = Instrux->field_0x1;
    uVar14 = 0xe;
    uVar36 = 0x1c;
    goto LAB_0015bda0;
  case 0x19:
    bVar30 = Instrux->field_0x1;
    uVar14 = 0x5e;
    uVar36 = 0x6c;
LAB_0015bda0:
    if ((bVar30 & 0xc) == 0) {
      uVar36 = uVar14;
    }
    break;
  case 0x1a:
    uVar36 = *(uint *)Instrux;
    pNVar35 = "\b\b\x10";
LAB_0015bce0:
    uVar21 = (ulong)(uVar36 & 3);
    goto LAB_0015ba22;
  case 0x1b:
  case 0x2c:
    uVar36 = 0x200;
    break;
  case 0x1c:
    uVar36 = 0xfffffffe;
    break;
  case 0x20:
  case 0x21:
  case 0x22:
  case 0x26:
  case 0x28:
    uVar12 = 0x20e;
    pNVar35 = "\x10 @\x02\x04\b";
    goto LAB_0015ba1d;
  case 0x23:
    uVar12 = 0x20e;
LAB_0015bc77:
    uVar21 = (ulong)(*(uint *)Instrux >> (sbyte)uVar12 & (1 << (sbyte)((ushort)uVar12 >> 8)) - 1U);
    pNVar35 = "\x02\x04\b";
    goto LAB_0015ba22;
  case 0x24:
    uVar12 = 0x20e;
    pNVar35 = "\x04\b\x10\b\x10 \x10 @\x02\x04\b";
    goto LAB_0015ba1d;
  case 0x25:
    uVar12 = 0x20e;
    pNVar35 = "\b\x10 \x10 @\x02\x04\b";
LAB_0015ba1d:
    uVar21 = (ulong)(*(uint *)Instrux >> (sbyte)uVar12 & (1 << (sbyte)((ushort)uVar12 >> 8)) - 1U);
    goto LAB_0015ba22;
  case 0x27:
    if ((*(uint *)Instrux & 0xc000) == 0) {
      return 0x80000101;
    }
    uVar21 = (ulong)(*(uint *)Instrux >> 0xe & 3);
    pNVar35 = "";
LAB_0015ba22:
    uVar36 = (uint)pNVar35[uVar21];
    break;
  case 0x29:
    uVar36 = 0x400;
    break;
  case 0x2a:
    uVar36 = 0x30;
    break;
  case 0x2d:
  case 0x2e:
  case 0x2f:
  case 0x30:
  case 0x31:
    iVar27 = (uint)(uVar26 != 0x30) * 3 + 5;
    if ((byte)(uVar26 - 0x2d) < 3) {
      iVar27 = (uVar26 - 0x2d & 0xff) + 2;
    }
    uVar36 = (uint)*(byte *)((long)&NdParseOperand_wszLut + (ulong)(*(uint *)Instrux >> 10 & 3)) *
             iVar27;
    break;
  case 0x32:
    uVar36 = 0xc;
    break;
  case 0x34:
  case 0x35:
  case 0x36:
    uVar36 = (uint)aVar31 >> 0xe & 3;
    uVar14 = 4;
    if (uVar36 != 0) {
      uVar14 = (uint)(byte)((uVar36 != 1) * '\b' + 8);
    }
    VsibRegSize = 0x10;
    if (uVar26 != 0x34) {
      VsibRegSize = (uint)(uVar26 != 0x35) * 0x20 + 0x20;
    }
    goto LAB_0015bf00;
  case 0x37:
    uVar36 = (uint)aVar31 >> 0xe & 3;
    uVar14 = 2;
    if (uVar36 != 0) {
      uVar14 = (uint)(byte)((uVar36 != 1) * '\x04' + 4);
    }
    VsibRegSize = (uint)(1 < uVar36) * 0x10 + 0x10;
    goto LAB_0015bf00;
  case 0x38:
    uVar36 = (uint)aVar31 >> 0xe & 3;
    uVar14 = 4;
    if (uVar36 != 0) {
      uVar14 = (uint)(byte)((uVar36 != 1) * '\b' + 8);
    }
    VsibRegSize = 0x10;
    if (uVar36 != 0) {
      VsibRegSize = (uint)(uVar36 != 1) * 0x20 + 0x20;
    }
LAB_0015bf00:
    uVar36 = uVar14 << (bVar34 ^ 3);
    local_34 = 4;
    goto LAB_0015bdb4;
  case 0x39:
  case 0x3a:
  case 0x3b:
    uVar36 = (uint)aVar31 >> 0xe & 3;
    uVar14 = 2;
    if (uVar36 != 0) {
      uVar14 = (uint)(byte)((uVar36 != 1) * '\x04' + 4);
    }
    VsibRegSize = 0x10;
    if (uVar26 != 0x39) {
      VsibRegSize = (uint)(uVar26 != 0x3a) * 0x20 + 0x20;
    }
    goto LAB_0015bd2e;
  case 0x3c:
    uVar36 = (uint)aVar31 >> 0xe & 3;
    uVar14 = 1;
    if (uVar36 != 0) {
      uVar14 = (uint)(byte)((uVar36 != 1) * '\x02' + 2);
    }
    VsibRegSize = (uint)(1 < uVar36) * 0x10 + 0x10;
    goto LAB_0015bd2e;
  case 0x3d:
    uVar36 = (uint)aVar31 >> 0xe & 3;
    uVar14 = 2;
    if (uVar36 != 0) {
      uVar14 = (uint)(byte)((uVar36 != 1) * '\x04' + 4);
    }
    VsibRegSize = 0x10;
    if (uVar36 != 0) {
      VsibRegSize = (uint)(uVar36 != 1) * 0x20 + 0x20;
    }
LAB_0015bd2e:
    uVar36 = uVar14 << (bVar34 ^ 3);
    local_34 = 8;
    goto LAB_0015bdb4;
  case 0x3e:
    uVar36 = 0xffffffff;
    break;
  default:
    goto LAB_0015ad8b;
  }
  VsibRegSize = 0;
  local_34 = 0;
  uVar14 = 0;
LAB_0015bdb4:
  Operand = pNVar1 + uVar37;
  Operand->Size = uVar36;
  if (0x69 < (byte)uVar5) {
    return 0x80000101;
  }
  uVar21 = uVar5 >> 0x20;
  uVar13 = (uint)uVar5 & 0xff;
  RelOffsetSize = (ND_UINT8)uVar36;
  local_50 = (char)(uVar5 >> 0x20);
  switch(uVar5 & 0xff) {
  case 0:
    if (uVar26 == 0x12) {
      NVar15 = NdFetchAddressFar(Instrux,Code_00,NVar10,Size,RelOffsetSize);
      if ((int)NVar15 < 0) {
        return NVar15;
      }
      *(undefined1 *)Operand = 0x45;
      (Operand->Info).Address.BaseSeg = (Instrux->field_74).Address.Cs;
      aVar23.Moffset._4_4_ = 0;
      aVar23.Displacement = (Instrux->field_74).Displacement;
    }
    else {
      NVar15 = NdFetchAddressNear(Instrux,Code_00,NVar10,Size,RelOffsetSize);
      if ((int)NVar15 < 0) {
        return NVar15;
      }
      *(undefined1 *)Operand = 0x46;
      aVar23 = Instrux->field_74;
    }
LAB_0015d24d:
    (Operand->Info).Immediate.Imm = (ND_UINT64)aVar23;
    break;
  case 1:
    *(undefined1 *)Operand = 0x31;
    (Operand->Info).Register.Type = ND_REG_GPR;
    (Operand->Info).Register.Size = uVar36;
    uVar26 = (uint)aVar31 >> 0x10 & 0xf;
    (Operand->Info).Register.Reg = uVar26;
    if (((uint)aVar31 >> 0x14 & 1) != 0) {
      if ((Instrux->FeatMode & 0x10) == 0) {
        return 0x80000005;
      }
      (Operand->Info).Register.Reg = uVar26 | 0x10;
    }
    break;
  case 2:
    *(undefined1 *)Operand = 0x11;
    (Operand->Info).Register.Type = ND_REG_CR;
    (Operand->Info).Register.Size = uVar36;
    uVar26 = (Instrux->ModRm).ModRm >> 3 & 7 | ((uint)aVar31 & 0x10) + ((uint)aVar31 & 2) * 4;
    (Operand->Info).Register.Reg = uVar26;
    if ((((undefined1  [488])*Instrux & (undefined1  [488])0x3) != (undefined1  [488])0x2) &&
       ((Instrux->field_0x5 & 0x80) != 0)) {
      uVar26 = uVar26 | 8;
      (Operand->Info).Register.Reg = uVar26;
    }
    if (8 < uVar26) {
      return 0x80000005;
    }
    if ((0x11dU >> (uVar26 & 0x1f) & 1) == 0) {
      return 0x80000005;
    }
    break;
  case 3:
    *(undefined1 *)Operand = 0x11;
    (Operand->Info).Register.Type = ND_REG_DR;
    (Operand->Info).Register.Size = uVar36;
    uVar26 = ((uint)aVar31 & 0x10) + ((uint)aVar31 & 2) * 4;
    (Operand->Info).Register.Reg = (Instrux->ModRm).ModRm >> 3 & 7 | uVar26;
    goto joined_r0x0015cca7;
  case 4:
    bVar29 = (Instrux->ModRm).ModRm;
    if (bVar29 < 0xc0) goto LAB_0015cd76;
    *(undefined1 *)Operand = 0x21;
    (Operand->Info).Register.Type = ND_REG_GPR;
    (Operand->Info).Register.Size = uVar36;
    uVar26 = bVar29 & 7 | (uint)aVar31 & 8;
    (Operand->Info).Register.Reg = uVar26;
    if (((uint)aVar31 & 0x40) != 0) {
      if ((Instrux->FeatMode & 0x10) == 0) {
        return 0x80000005;
      }
      uVar26 = uVar26 | 0x10;
      (Operand->Info).Register.Reg = uVar26;
    }
    goto joined_r0x0015c963;
  case 5:
    *(undefined1 *)Operand = 0xc1;
    (Operand->Info).Register.Type = ND_REG_FLG;
    (Operand->Info).Register.Size = uVar36;
    (Operand->Info).Register.Reg = 0;
    Instrux->RflAccess = Instrux->RflAccess | bVar11;
    break;
  case 6:
    *(undefined1 *)Operand = 0x11;
    (Operand->Info).Register.Type = ND_REG_GPR;
    (Operand->Info).Register.Size = uVar36;
    uVar26 = ((Instrux->ModRm).ModRm >> 3 & 7) + ((uint)aVar31 & 2) * 4;
    (Operand->Info).Register.Reg = uVar26;
    uVar14 = (uint)aVar31 & 0x10;
    goto joined_r0x0015c800;
  case 7:
    *(undefined1 *)Operand = 0x31;
    (Operand->Info).Register.Type = ND_REG_SSE;
    uVar26 = 0x10;
    if (0x10 < uVar36) {
      uVar26 = uVar36;
    }
    (Operand->Info).Register.Size = uVar26;
    uVar12 = 0x510;
    goto LAB_0015cb7d;
  case 8:
    NVar15 = NdFetchImmediate(Instrux,Code_00,NVar10,Size,RelOffsetSize);
    if ((int)NVar15 < 0) {
      return NVar15;
    }
    if ((Instrux->field_0x7 & 8) == 0) {
      aVar23 = (anon_union_8_5_2338f8ca_for__INSTRUX_88)Instrux->Immediate1;
    }
    else {
      aVar23.Moffset._1_7_ = 0;
      aVar23.Displacement._0_1_ = (Instrux->field_76).Immediate2;
    }
    *(undefined1 *)Operand = 99;
    (Operand->Info).Immediate.RawSize = RelOffsetSize;
    if (((Operand->Flags).Flags & 4) == 0) {
      if (((Operand->Flags).Flags & 2) == 0) goto LAB_0015d24d;
      uVar26 = Instrux->Operands[0].Size;
    }
    else {
      uVar26 = (uint)*(byte *)((long)&NdParseOperand_wszLut + (ulong)(*(uint *)Instrux >> 10 & 3));
    }
    Operand->Size = uVar26;
    bVar29 = (byte)(uVar36 << 3);
    sVar6 = (bVar29 < 0x41) * ('@' - bVar29);
    sVar7 = (bVar29 < 0x41) * ('@' - bVar29);
    uVar22 = 0;
    if ((aVar23.Moffset >> ((ulong)(byte)(bVar29 - 1) & 0x3f) & 1) != 0) {
      uVar22 = ~((ulong)(-1L << sVar6) >> sVar6);
    }
    (Operand->Info).Immediate.Imm = uVar22 | (aVar23.Moffset << sVar7) >> sVar7;
    break;
  case 9:
    NVar15 = NdFetchRelativeOffset(Instrux,Code_00,NVar10,Size,RelOffsetSize);
    if ((int)NVar15 < 0) {
      return NVar15;
    }
    Instrux->field_0xa = Instrux->field_0xa | 0x10;
    *(undefined1 *)Operand = 0x44;
    bVar29 = (byte)(uVar36 << 3);
    sVar7 = (bVar29 < 0x41) * ('@' - bVar29);
    Operand->Size = *(uint *)&Instrux->field_0xc & 0xf;
    sVar6 = (bVar29 < 0x21) * (' ' - bVar29);
    uVar22 = (ulong)((Instrux->field_74).Displacement >> ((byte)(bVar29 - 1) & 0x1f) & 1) *
             ~((ulong)(-1L << sVar7) >> sVar7) |
             (ulong)(((Instrux->field_74).Displacement << sVar6) >> sVar6);
    goto LAB_0015c817;
  case 10:
    Instrux->MemoryAccess = Instrux->MemoryAccess | bVar11;
    *(undefined1 *)Operand = 0xc2;
    (Operand->Info).Memory.BaseSize =
         *(ND_UINT8 *)((long)&NdParseOperand_wszLut + (ulong)(*(uint *)Instrux >> 4 & 3));
    *(ushort *)&Operand->Info = *(ushort *)&Operand->Info | 0x83;
    *(undefined1 *)((long)&Operand->Info + 10) = 0x22;
    *(ulong *)&Instrux->field_0xc =
         *(ulong *)&Instrux->field_0xc & 0xffffffffffffff0f |
         (ulong)((Operand->Size / ((uint)*(ulong *)&Instrux->field_0xc & 0xf) & 0xf) << 4);
    Instrux->StackAccess = Instrux->StackAccess | bVar11;
    break;
  case 0xb:
    NVar15 = NdFetchSseImmediate(Instrux,Code_00,NVar10,Size,(byte)uVar5);
    if ((int)NVar15 < 0) {
      return NVar15;
    }
    *(undefined1 *)Operand = 0x91;
    (Operand->Info).Register.Type = ND_REG_SSE;
    uVar26 = 0x10;
    if (0x10 < uVar36) {
      uVar26 = uVar36;
    }
    (Operand->Info).Register.Size = uVar26;
    NVar17 = (ND_REG_TYPE)((Instrux->field_76).Immediate2 >> 4);
    (Operand->Info).Register.Reg = NVar17;
    if (((undefined1  [488])*Instrux & (undefined1  [488])0x3) != (undefined1  [488])0x2)
    goto LAB_0015cb17;
    break;
  case 0xc:
    if (0xbf < (Instrux->ModRm).ModRm) {
      return 0x80000002;
    }
    goto LAB_0015cd76;
  case 0xd:
    NVar17 = (ND_REG_TYPE)(Instrux->ModRm).ModRm;
    if (NVar17 < 0xc0) {
      return 0x80000002;
    }
LAB_0015c905:
    NVar24 = 0x800000004;
    *(undefined1 *)Operand = 0x21;
LAB_0015cb12:
    (Operand->Info).Immediate.Imm = NVar24;
    goto LAB_0015cb17;
  case 0xe:
    NVar15 = NdFetchMoffset(Instrux,Code_00,NVar10,Size,(ND_UINT8)(2 << (*(byte *)Instrux >> 6)));
    if ((int)NVar15 < 0) {
      return NVar15;
    }
    Instrux->MemoryAccess = Instrux->MemoryAccess | (Operand->Access).Access;
    *(undefined1 *)Operand = 0x42;
    (Operand->Info).Memory.DispSize = Instrux->field_0xf & 0xf;
    (Operand->Info).Memory.Disp = (ND_UINT64)Instrux->field_74;
    *(ushort *)&Operand->Info = *(ushort *)&Operand->Info | 0x409;
    bVar29 = NdGetSegOverride(Instrux,'\x03');
    *(byte *)((long)&Operand->Info + 10) = *(byte *)((long)&Operand->Info + 10) & 0xf8 | bVar29;
    break;
  case 0xf:
    *(undefined1 *)Operand = 0x11;
    (Operand->Info).Immediate.Imm = 0x800000004;
    goto LAB_0015cf6c;
  case 0x10:
    NVar17 = (ND_REG_TYPE)(Instrux->ModRm).ModRm;
    if (0xbf < (Instrux->ModRm).ModRm) goto LAB_0015c905;
    goto LAB_0015cd76;
  case 0x11:
    bVar29 = (Instrux->ModRm).ModRm;
    if ((bVar29 < 0xc0) && ((Instrux->Attributes & 0x20000) == 0)) {
      return 0x80000002;
    }
    *(undefined1 *)Operand = 0x21;
    (Operand->Info).Register.Type = ND_REG_GPR;
    (Operand->Info).Register.Size = uVar36;
    goto LAB_0015c7f4;
  case 0x12:
    *(undefined1 *)Operand = 0x11;
    (Operand->Info).Register.Type = ND_REG_SEG;
    (Operand->Info).Register.Size = uVar36;
    uVar26 = (Instrux->ModRm).ModRm >> 3 & 7;
    (Operand->Info).Register.Reg = uVar26;
    bVar29 = (byte)uVar26;
    if (5 < bVar29) {
      return 0x80000005;
    }
    if (((uVar5 & 0x2000000) != 0) && (bVar29 == 1)) {
      return 0x8000000b;
    }
    break;
  case 0x13:
    *(undefined1 *)Operand = 0x11;
    (Operand->Info).Register.Type = ND_REG_TR;
    (Operand->Info).Register.Size = uVar36;
    (Operand->Info).Register.Reg = (Instrux->ModRm).ModRm >> 3 & 7 | ((uint)aVar31 & 2) << 2;
    uVar26 = (uint)aVar31 & 2;
    goto joined_r0x0015cca7;
  case 0x14:
    bVar34 = (Instrux->ModRm).ModRm;
    if (bVar34 < 0xc0) {
      return 0x80000002;
    }
    *(undefined1 *)Operand = 0x21;
    (Operand->Info).Register.Type = ND_REG_SSE;
    uVar26 = 0x10;
    if (0x10 < uVar36) {
      uVar26 = uVar36;
    }
    bVar29 = bVar29 & 8 | bVar34 & 7;
    (Operand->Info).Register.Size = uVar26;
LAB_0015cbc4:
    (Operand->Info).Register.Reg = (uint)bVar29;
    if ((Instrux->field_0x5 & 0x10) == 0) break;
    NVar17 = (uint)bVar29 + ((uint)aVar31 & 4) * 4;
    goto LAB_0015cf7a;
  case 0x15:
    *(undefined1 *)Operand = 0x11;
    (Operand->Info).Register.Type = ND_REG_SSE;
    uVar26 = 0x10;
    if (0x10 < uVar36) {
      uVar26 = uVar36;
    }
    (Operand->Info).Register.Size = uVar26;
    uVar26 = ((Instrux->ModRm).ModRm >> 3 & 7) + ((uint)aVar31 & 2) * 4;
    (Operand->Info).Register.Reg = uVar26;
    if ((Instrux->field_0x5 & 0x10) != 0) {
      (Operand->Info).Register.Reg = (uint)aVar31 & 0x10 | uVar26;
    }
    break;
  case 0x16:
    bVar30 = (Instrux->ModRm).ModRm;
    if (0xbf < bVar30) {
      *(undefined1 *)Operand = 0x21;
      (Operand->Info).Register.Type = ND_REG_SSE;
      uVar26 = 0x10;
      if (0x10 < uVar36) {
        uVar26 = uVar36;
      }
      bVar29 = bVar29 & 8 | bVar30 & 7;
      (Operand->Info).Register.Size = uVar26;
      goto LAB_0015cbc4;
    }
    goto LAB_0015cd76;
  case 0x17:
  case 0x18:
  case 0x4b:
    Instrux->MemoryAccess = Instrux->MemoryAccess | bVar11;
    *(undefined1 *)Operand = 0xc2;
    (Operand->Info).Memory.BaseSize = (ND_UINT8)(2 << (*(byte *)Instrux >> 6));
    bVar34 = (uVar13 != 0x17) << 3 | 0x30;
    *(byte *)((long)&Operand->Info + 10) = *(byte *)((long)&Operand->Info + 10) & 7 | bVar34;
    *(ushort *)&Operand->Info =
         (ushort)(uVar13 - 0x17 < 2) << 8 | (ushort)(Operand->Info).Register.Type & 0xfefc | 3;
    if (uVar13 != 0x18) goto LAB_0015c324;
    *(undefined1 *)((long)&Operand->Info + 10) = 0x38;
    break;
  case 0x19:
    *(undefined1 *)Operand = 0x51;
    (Operand->Info).Register.Type = ND_REG_GPR;
    (Operand->Info).Register.Size = uVar36;
    bVar29 = (Instrux->field_99).PrimaryOpCode;
LAB_0015c7f4:
    uVar26 = bVar29 & 7 | (uint)aVar31 & 8;
    (Operand->Info).Register.Reg = uVar26;
    uVar14 = (uint)aVar31 & 0x40;
joined_r0x0015c800:
    if (uVar14 != 0) {
      if ((Instrux->FeatMode & 0x10) == 0) {
        return 0x80000005;
      }
      uVar26 = uVar26 | 0x10;
      (Operand->Info).Register.Reg = uVar26;
    }
joined_r0x0015c963:
    bVar39 = false;
    if ((uVar36 == 1) && (bVar39 = false, 3 < uVar26)) {
      if (((Instrux->field_0x2 & 0xf) == 0) && ((*(uint *)&Instrux->field_0x5 & 1) == 0)) {
        bVar39 = (*(uint *)&Instrux->field_0x5 & 2) == 0;
      }
      else {
        bVar39 = false;
      }
    }
    *(byte *)((long)&Operand->Info + 0xd) = *(byte *)((long)&Operand->Info + 0xd) & 0xfe | bVar39;
    break;
  case 0x1a:
    *(undefined1 *)Operand = 0x11;
    (Operand->Info).Register.Type = ND_REG_BND;
    (Operand->Info).Register.Size = uVar36;
    uVar26 = ((Instrux->ModRm).ModRm >> 3 & 7) + ((uint)aVar31 & 2) * 4;
LAB_0015cd64:
    (Operand->Info).Register.Reg = uVar26;
    if (3 < (byte)uVar26) {
      return 0x80000005;
    }
    break;
  case 0x1b:
    bVar30 = (Instrux->ModRm).ModRm;
    if (0xbf < bVar30) {
      *(undefined1 *)Operand = 0x21;
      (Operand->Info).Register.Type = ND_REG_BND;
      (Operand->Info).Register.Size = uVar36;
      uVar26 = (uint)(bVar29 & 8 | bVar30 & 7);
      goto LAB_0015cd64;
    }
    goto LAB_0015cd76;
  case 0x1c:
    *(undefined1 *)Operand = 0x11;
    (Operand->Info).Register.Type = ND_REG_MSK;
    if (((uint)aVar31 & 0x12) != 0) {
      return 0x80000005;
    }
    (Operand->Info).Register.Size = 8;
LAB_0015cf6c:
    NVar17 = (Instrux->ModRm).ModRm >> 3 & ND_REG_DR;
    goto LAB_0015cf7a;
  case 0x1d:
    *(undefined1 *)Operand = 0x31;
    uVar26 = (uint)aVar31 >> 0x10 & 0xf;
    (Operand->Info).Immediate.Imm = 0x80000000a;
    (Operand->Info).Register.Reg = uVar26;
    if (7 < uVar26) {
      return 0x80000005;
    }
    break;
  case 0x1e:
    NVar17 = (ND_REG_TYPE)(Instrux->ModRm).ModRm;
    if (0xbf < NVar17) {
      *(undefined1 *)Operand = 0x21;
      NVar24 = 0x80000000a;
      goto LAB_0015cb12;
    }
LAB_0015cd76:
    Instrux->MemoryAccess = Instrux->MemoryAccess | bVar11;
    *(undefined1 *)Operand = 0x22;
    (Operand->Info).DefaultFlags = (ND_OPDESC_DEFAULT_FLAGS)((byte)(Operand->Info).DefaultFlags | 1)
    ;
    if ((undefined1  [488])((undefined1  [488])*Instrux & (undefined1  [488])0xc0) ==
        (undefined1  [488])0x0) {
      NVar15 = NdParseMemoryOperand16(Instrux,Operand);
    }
    else {
      NVar15 = NdParseMemoryOperand3264(Instrux,Operand,VsibRegSize);
    }
    if ((int)NVar15 < 0) {
      return NVar15;
    }
    uVar26 = *(uint *)&Instrux->field_0x5;
    if ((uVar26 >> 10 & 1) != 0) {
      bVar29 = *(byte *)((long)&Operand->Info + 10);
      bVar11 = NdGetSegOverride(Instrux,bVar29 & 7);
      *(byte *)((long)&Operand->Info + 10) = bVar29 & 0xf8 | bVar11;
    }
    NVar24 = Instrux->Attributes;
    if ((char)NVar24 < '\0') {
      if ((uVar26 >> 0xc & 1) == 0) {
        return 0x80000030;
      }
      pbVar2 = (byte *)((long)&Operand->Info + 1);
      *pbVar2 = *pbVar2 | 0x40;
      *(undefined1 *)((long)&Operand->Info + 7) = local_34;
      *(char *)((long)&Operand->Info + 9) = (char)uVar14;
      (Operand->Info).Immediate.RawSize = (ND_UINT8)(uVar36 / uVar14);
    }
    if (((uint)NVar24 >> 0x1b & 1) == 0) {
      uVar32 = *(ushort *)&Operand->Info;
    }
    else {
      if ((uVar26 >> 0xc & 1) == 0) {
        return 0x80000042;
      }
      uVar32 = (ushort)(Operand->Info).Register.Type | 0x8000;
    }
    if ((uVar26 >> 0x16 & 1) != 0) {
      uVar14 = 4;
      if (((uVar21 & 4) == 0) && (uVar14 = 8, (uVar5 & 0x800000000) == 0)) {
        uVar14 = 2;
        if ((uVar21 & 0x40) == 0) {
          uVar14 = (uint)(bVar34 ^ 1) * 4 + 4;
        }
      }
      Operand->Size = uVar14;
      (Operand->Info).Immediate.RawSize = (ND_UINT8)uVar14;
      uVar32 = uVar32 | 0x20;
      *(char *)((long)&Operand->Info + 7) = (char)(uVar36 / uVar14);
    }
    if ((uVar26 >> 0x15 & 1) != 0) {
      uVar32 = uVar32 | 0x10;
      *(ushort *)&Operand->Info = uVar32;
      NVar10 = NdGetCompDispSize(Instrux,Operand->Size);
      (Operand->Info).Memory.CompDispSize = NVar10;
    }
    uVar26 = (uint)Instrux->Attributes;
    uVar9 = (ushort)((uVar26 & 0x100) << 5);
    uVar8 = (ushort)(Instrux->Attributes >> 9) & 0x800;
    uVar25 = uVar8 | uVar32 & 0xd7ff | uVar9;
    *(ushort *)&Operand->Info = uVar25;
    if ((uVar26 >> 0x15 & 1) != 0) {
      uVar25 = uVar8 | uVar32 & 0xc7fe | uVar9 | 0x1000;
      *(ushort *)&Operand->Info = uVar25;
      pbVar2 = (byte *)((long)&Operand->Info + 10);
      *pbVar2 = *pbVar2 & 0xf8;
    }
    if ((uVar26 >> 0x16 & 1) != 0) {
      *(ushort *)&Operand->Info = uVar25 | 0x200;
      (Operand->Info).Memory.ShStkType = '\x01';
    }
    break;
  case 0x1f:
    *(undefined1 *)Operand = 0xa1;
    (Operand->Info).Immediate.Imm = 0x80000000a;
    uVar12 = 0x317;
LAB_0015cb7d:
    NVar17 = (uint)aVar31 >> (sbyte)uVar12 & (1 << (sbyte)((ushort)uVar12 >> 8)) - ND_REG_GPR;
LAB_0015cf7a:
    (Operand->Info).Register.Reg = NVar17;
    break;
  case 0x20:
    *(undefined1 *)Operand = 0x12;
    uVar32 = (ushort)(Operand->Info).Register.Type;
    *(ushort *)&Operand->Info = uVar32 | 2;
    bVar29 = (bVar29 & 2) << 5 | (Instrux->ModRm).ModRm & 0x38;
    *(byte *)((long)&Operand->Info + 10) = *(byte *)((long)&Operand->Info + 10) & 7 | bVar29;
    if (((uint)aVar31 & 0x10) != 0) {
      if ((Instrux->FeatMode & 0x10) == 0) {
        return 0x80000005;
      }
      bVar29 = bVar29 | 0x80;
    }
    (Operand->Info).Memory.BaseSize = (ND_UINT8)(2 << (*(byte *)Instrux >> 6));
    *(ushort *)&Operand->Info = uVar32 | 3;
    *(byte *)((long)&Operand->Info + 10) = bVar29;
    break;
  case 0x21:
    *(undefined1 *)Operand = 0x22;
    uVar32 = (ushort)(Operand->Info).Register.Type;
    *(ushort *)&Operand->Info = uVar32 | 2;
    bVar34 = (bVar29 & 8 | (Instrux->ModRm).ModRm & 7) << 3;
    bVar29 = *(byte *)((long)&Operand->Info + 10) & 7 | bVar34;
    *(byte *)((long)&Operand->Info + 10) = bVar29;
    if (((uint)aVar31 & 0x40) != 0) {
      if ((Instrux->FeatMode & 0x10) == 0) {
        return 0x80000005;
      }
      bVar34 = bVar34 | 0x80;
      *(byte *)((long)&Operand->Info + 10) = bVar29 | 0x80;
    }
    (Operand->Info).Memory.BaseSize = (ND_UINT8)(2 << (*(byte *)Instrux >> 6));
    *(ushort *)&Operand->Info = uVar32 | 3;
LAB_0015c324:
    bVar29 = NdGetSegOverride(Instrux,'\x03');
    bVar29 = bVar29 | bVar34;
    goto LAB_0015d0e7;
  case 0x22:
    *(undefined1 *)Operand = 0x11;
    (Operand->Info).Register.Type = ND_REG_TILE;
    (Operand->Info).Register.Size = uVar36;
    (Operand->Info).Register.Reg = (Instrux->ModRm).ModRm >> 3 & 7;
    uVar26 = (uint)aVar31 & 0x12;
    goto joined_r0x0015cca7;
  case 0x23:
    *(undefined1 *)Operand = 0x21;
    (Operand->Info).Register.Type = ND_REG_TILE;
    (Operand->Info).Register.Size = uVar36;
    (Operand->Info).Register.Reg = (Instrux->ModRm).ModRm & 7;
    uVar26 = (uint)aVar31 & 0x48;
joined_r0x0015cca7:
    if (uVar26 != 0) {
      return 0x80000005;
    }
    break;
  case 0x24:
    *(undefined1 *)Operand = 0x31;
    (Operand->Info).Register.Type = ND_REG_TILE;
    (Operand->Info).Register.Size = uVar36;
    uVar26 = (uint)aVar31 >> 0x10 & 0xf;
    (Operand->Info).Register.Reg = uVar26;
    if (((uint)aVar31 >> 0x14 & 1) != 0) {
      return 0x80000005;
    }
    if (7 < uVar26) {
      return 0x80000005;
    }
    break;
  case 0x25:
    *(undefined1 *)Operand = 0x39;
    (Operand->Info).DefaultFlags =
         (ND_OPDESC_DEFAULT_FLAGS)(aVar31._2_1_ & 0xf | (byte)(Operand->Info).DefaultFlags & 0xf0);
    Operand->Size = 0;
    break;
  case 0x26:
    *(undefined1 *)Operand = 0x87;
    (Operand->Info).Immediate.Imm = 1;
    break;
  case 0x27:
    *(undefined1 *)Operand = 0xc1;
    (Operand->Info).Register.Type = ND_REG_RIP;
    (Operand->Info).Register.Size = uVar36;
    (Operand->Info).Register.Reg = 0;
    Instrux->RipAccess = Instrux->RipAccess | bVar11;
    if (((Instrux->Operands[0].Flags.Flags & 1) != 0) ||
       (bVar29 = 4, 1 < (byte)((*(byte *)pNVar1 & 0xf) - 1))) {
      bVar29 = (Instrux->Category == ND_CAT_RET) << 2;
    }
    Instrux->BranchInfo =
         (ND_BRANCH_INFO)
         (((Instrux->CsAccess & 10) != 0) << 3 | bVar29 |
          (byte)Instrux->BranchInfo & 0xf0 | (Instrux->Category == ND_CAT_COND_BR) * '\x02' | 1);
    break;
  case 0x28:
    *(undefined1 *)Operand = 0xc1;
    NVar24 = 0x400000010;
    goto LAB_0015d070;
  case 0x29:
    *(undefined1 *)Operand = 0xc1;
    NVar24 = 0x400000011;
    goto LAB_0015d070;
  case 0x2a:
    *(undefined1 *)Operand = 0xc1;
    (Operand->Info).Register.Type = ND_REG_SSP;
    goto LAB_0015d01c;
  case 0x2b:
    *(undefined1 *)Operand = 0xc1;
    NVar24 = 0x100000015;
    goto LAB_0015d070;
  case 0x2c:
    *(undefined1 *)Operand = 0xc1;
    (Operand->Info).Immediate.Imm = 0x100000001;
    (Operand->Info).Register.Reg = 4;
    pbVar2 = (byte *)((long)&Operand->Info + 0xd);
    *pbVar2 = *pbVar2 | 1;
    break;
  case 0x2d:
    *(undefined1 *)Operand = 0xc1;
    (Operand->Info).Register.Type = ND_REG_GPR;
    goto LAB_0015d01c;
  case 0x2e:
    NVar17 = ND_REG_GPR;
    *(undefined1 *)Operand = 0xc1;
    goto LAB_0015c50d;
  case 0x2f:
    *(undefined1 *)Operand = 0xc1;
    (Operand->Info).Register.Type = ND_REG_GPR;
    goto LAB_0015cf43;
  case 0x30:
    *(undefined1 *)Operand = 0xc1;
    (Operand->Info).Register.Type = ND_REG_GPR;
    goto LAB_0015d091;
  case 0x31:
    *(undefined1 *)Operand = 0xc1;
    (Operand->Info).Register.Type = ND_REG_GPR;
    goto LAB_0015cac0;
  case 0x32:
    *(undefined1 *)Operand = 0xc1;
    (Operand->Info).Register.Type = ND_REG_GPR;
    goto LAB_0015cae1;
  case 0x33:
    *(undefined1 *)Operand = 0xc1;
    (Operand->Info).Register.Type = ND_REG_GPR;
    (Operand->Info).Register.Size = uVar36;
    (Operand->Info).Register.Reg = 6;
    break;
  case 0x34:
    *(undefined1 *)Operand = 0xc1;
    (Operand->Info).Register.Type = ND_REG_GPR;
    (Operand->Info).Register.Size = uVar36;
    (Operand->Info).Register.Reg = 7;
    break;
  case 0x35:
    *(undefined1 *)Operand = 0xc1;
    (Operand->Info).Register.Type = ND_REG_GPR;
    (Operand->Info).Register.Size = uVar36;
    (Operand->Info).Register.Reg = 8;
    break;
  case 0x36:
    *(undefined1 *)Operand = 0xc1;
    (Operand->Info).Register.Type = ND_REG_GPR;
    (Operand->Info).Register.Size = uVar36;
    (Operand->Info).Register.Reg = 9;
    break;
  case 0x37:
    *(undefined1 *)Operand = 0xc1;
    (Operand->Info).Register.Type = ND_REG_GPR;
    (Operand->Info).Register.Size = uVar36;
    (Operand->Info).Register.Reg = 0xb;
    break;
  case 0x38:
    *(undefined1 *)Operand = 0xc1;
    (Operand->Info).Register.Type = ND_REG_SEG;
    (Operand->Info).Register.Size = uVar36;
    (Operand->Info).Register.Reg = 1;
    Instrux->CsAccess = Instrux->CsAccess | bVar11;
    break;
  case 0x39:
    *(undefined1 *)Operand = 0xc1;
    NVar17 = ND_REG_SEG;
LAB_0015c50d:
    (Operand->Info).Register.Type = NVar17;
    (Operand->Info).Register.Size = uVar36;
    goto LAB_0015cf7a;
  case 0x3a:
    *(undefined1 *)Operand = 0xc1;
    (Operand->Info).Register.Type = ND_REG_SEG;
    goto LAB_0015d091;
  case 0x3b:
    *(undefined1 *)Operand = 0xc1;
    (Operand->Info).Register.Type = ND_REG_SEG;
    goto LAB_0015d01c;
  case 0x3c:
    *(undefined1 *)Operand = 0xc1;
    (Operand->Info).Register.Type = ND_REG_SEG;
LAB_0015cac0:
    (Operand->Info).Register.Size = uVar36;
    (Operand->Info).Register.Reg = 4;
    break;
  case 0x3d:
    *(undefined1 *)Operand = 0xc1;
    (Operand->Info).Register.Type = ND_REG_SEG;
LAB_0015cae1:
    (Operand->Info).Register.Size = uVar36;
    (Operand->Info).Register.Reg = 5;
    break;
  case 0x3e:
    NVar24 = 0xa00000003;
    *(undefined1 *)Operand = 0xc1;
    goto LAB_0015d070;
  case 0x3f:
    *(undefined1 *)Operand = 0x21;
    (Operand->Info).Immediate.Imm = 0xa00000003;
    NVar17 = (ND_REG_TYPE)(Instrux->ModRm).ModRm;
LAB_0015cb17:
    NVar17 = NVar17 & ND_REG_DR;
    goto LAB_0015cf7a;
  default:
    *(undefined1 *)Operand = 0xc1;
    (Operand->Info).Immediate.Imm = 0x1000000005;
    (Operand->Info).Register.Reg = uVar13 - 0x40;
    break;
  case 0x48:
    Instrux->MemoryAccess = Instrux->MemoryAccess | bVar11;
    *(undefined1 *)Operand = 0xc2;
    (Operand->Info).Memory.BaseSize = (ND_UINT8)(2 << (*(byte *)Instrux >> 6));
    pbVar2 = (byte *)((long)&Operand->Info + 10);
    *pbVar2 = *pbVar2 & 7;
    *(ushort *)&Operand->Info = *(ushort *)&Operand->Info | 3;
    bVar29 = NdGetSegOverride(Instrux,'\x03');
    goto LAB_0015d0e7;
  case 0x49:
    Instrux->MemoryAccess = Instrux->MemoryAccess | bVar11;
    *(undefined1 *)Operand = 0xc2;
    (Operand->Info).Memory.BaseSize = (ND_UINT8)(2 << (*(byte *)Instrux >> 6));
    *(byte *)((long)&Operand->Info + 10) = *(byte *)((long)&Operand->Info + 10) & 7 | 8;
    *(ushort *)&Operand->Info = *(ushort *)&Operand->Info | 3;
    bVar29 = NdGetSegOverride(Instrux,'\x03');
    bVar29 = bVar29 | 8;
    goto LAB_0015d0e7;
  case 0x4a:
    Instrux->MemoryAccess = Instrux->MemoryAccess | bVar11;
    *(undefined1 *)Operand = 0xc2;
    (Operand->Info).Memory.BaseSize = (ND_UINT8)(2 << (*(byte *)Instrux >> 6));
    (Operand->Info).Memory.IndexSize = '\x01';
    *(byte *)((long)&Operand->Info + 10) = *(byte *)((long)&Operand->Info + 10) & 7 | 0x18;
    (Operand->Info).Memory.Index = '\0';
    (Operand->Info).Register.Count = ((Operand->Info).Register.Count & 0xf0) + 1;
    *(ushort *)&Operand->Info = *(ushort *)&Operand->Info | 7;
    bVar29 = NdGetSegOverride(Instrux,'\x03');
    bVar29 = bVar29 | 0x18;
LAB_0015d0e7:
    *(byte *)((long)&Operand->Info + 10) = bVar29;
    break;
  case 0x4c:
    Instrux->MemoryAccess = Instrux->MemoryAccess | bVar11;
    *(undefined1 *)Operand = 0xc2;
    (Operand->Info).Memory.BaseSize = (ND_UINT8)(2 << (*(byte *)Instrux >> 4 & 3));
    *(ushort *)&Operand->Info = *(ushort *)&Operand->Info | 3;
    *(undefined1 *)((long)&Operand->Info + 10) = 0x2a;
    break;
  case 0x4d:
    Instrux->MemoryAccess = Instrux->MemoryAccess | bVar11;
    *(undefined1 *)Operand = 0xc2;
    pbVar2 = (byte *)((long)&Operand->Info + 1);
    *pbVar2 = *pbVar2 | 2;
    (Operand->Info).Memory.ShStkType = '\x02';
    break;
  case 0x4e:
    Instrux->MemoryAccess = Instrux->MemoryAccess | bVar11;
    *(undefined1 *)Operand = 0xc2;
    pbVar2 = (byte *)((long)&Operand->Info + 1);
    *pbVar2 = *pbVar2 | 2;
    (Operand->Info).Memory.ShStkType = '\x03';
    break;
  case 0x4f:
    Instrux->MemoryAccess = Instrux->MemoryAccess | bVar11;
    *(undefined1 *)Operand = 0xc2;
    pbVar2 = (byte *)((long)&Operand->Info + 1);
    *pbVar2 = *pbVar2 | 2;
    (Operand->Info).Memory.ShStkType = '\x04';
    break;
  case 0x50:
    Instrux->MemoryAccess = Instrux->MemoryAccess | bVar11;
    *(undefined1 *)Operand = 0xc2;
    uVar32 = (ushort)(Operand->Info).Register.Type;
    (Operand->Info).Memory.BaseSize = (ND_UINT8)(2 << (*(byte *)Instrux >> 6));
    bVar29 = *(byte *)((long)&Operand->Info + 10) & 7 | 0x30;
    goto LAB_0015ca9c;
  case 0x51:
    Instrux->MemoryAccess = Instrux->MemoryAccess | bVar11;
    *(undefined1 *)Operand = 0xc2;
    uVar32 = (ushort)(Operand->Info).Register.Type;
    (Operand->Info).Memory.BaseSize = (ND_UINT8)(2 << (*(byte *)Instrux >> 6));
    bVar29 = *(byte *)((long)&Operand->Info + 10) & 7 | 0x38;
LAB_0015ca9c:
    *(byte *)((long)&Operand->Info + 10) = bVar29;
    *(ushort *)&Operand->Info = uVar32 & 0xfffc | 2;
    break;
  case 0x52:
    *(undefined1 *)Operand = 0x93;
    uVar22 = (ulong)((Instrux->field_76).Immediate2 & 3);
LAB_0015c817:
    *(ulong *)&Operand->Info = uVar22;
    (Operand->Info).Immediate.RawSize = RelOffsetSize;
    break;
  case 0x53:
    *(undefined1 *)Operand = 0xc1;
    (Operand->Info).Register.Type = ND_REG_CR;
    goto LAB_0015d01c;
  case 0x54:
    *(undefined1 *)Operand = 0xc1;
    (Operand->Info).Register.Type = ND_REG_SYS;
    (Operand->Info).Register.Size = uVar36;
    goto LAB_0015d1cb;
  case 0x55:
    *(undefined1 *)Operand = 0xc1;
    (Operand->Info).Register.Type = ND_REG_SYS;
LAB_0015d01c:
    (Operand->Info).Register.Size = uVar36;
    goto LAB_0015d075;
  case 0x56:
    *(undefined1 *)Operand = 0xc1;
    (Operand->Info).Register.Type = ND_REG_SYS;
LAB_0015cf43:
    (Operand->Info).Register.Size = uVar36;
LAB_0015d1a9:
    (Operand->Info).Register.Reg = 2;
    break;
  case 0x57:
    *(undefined1 *)Operand = 0xc1;
    (Operand->Info).Register.Type = ND_REG_SYS;
LAB_0015d091:
    (Operand->Info).Register.Size = uVar36;
    (Operand->Info).Register.Reg = 3;
    break;
  case 0x58:
    *(undefined1 *)Operand = 0xc1;
    NVar24 = 0x20000000e;
    goto LAB_0015d070;
  case 0x59:
    *(undefined1 *)Operand = 0xc1;
    (Operand->Info).Immediate.Imm = 0x20000000e;
LAB_0015d1cb:
    (Operand->Info).Register.Reg = 1;
    break;
  case 0x5a:
    *(undefined1 *)Operand = 0xc1;
    (Operand->Info).Immediate.Imm = 0x20000000e;
    goto LAB_0015d1a9;
  case 0x5b:
    *(undefined1 *)Operand = 0xb1;
    (Operand->Info).Immediate.Imm = 0x80000000c;
    (Operand->Info).Register.Reg = 0xffffffff;
    break;
  case 0x5c:
    *(undefined1 *)Operand = 0xb1;
    (Operand->Info).Immediate.Imm = 0x80000000d;
    (Operand->Info).Register.Reg = 0xff;
    break;
  case 0x5d:
    *(undefined1 *)Operand = 0xc1;
    (Operand->Info).Immediate.Imm = 0x80000000c;
    (Operand->Info).Register.Reg = 0x10;
    break;
  case 0x5e:
    *(undefined1 *)Operand = 0xc1;
    (Operand->Info).Immediate.Imm = 0x80000000c;
    (Operand->Info).Register.Reg = 0xc0000103;
    break;
  case 0x5f:
    *(undefined1 *)Operand = 0xc1;
    (Operand->Info).Immediate.Imm = 0x80000000c;
    (Operand->Info).Register.Reg = 0x176;
    break;
  case 0x60:
    *(undefined1 *)Operand = 0xc1;
    (Operand->Info).Immediate.Imm = 0x80000000c;
    (Operand->Info).Register.Reg = 0x175;
    break;
  case 0x61:
    *(undefined1 *)Operand = 0xc1;
    (Operand->Info).Immediate.Imm = 0x80000000c;
    (Operand->Info).Register.Reg = 0x174;
    break;
  case 0x62:
    *(undefined1 *)Operand = 0xc1;
    (Operand->Info).Immediate.Imm = 0x80000000c;
    (Operand->Info).Register.Reg = 0xc0000081;
    break;
  case 99:
    *(undefined1 *)Operand = 0xc1;
    (Operand->Info).Immediate.Imm = 0x80000000c;
    (Operand->Info).Register.Reg = 0xc0000082;
    break;
  case 100:
    *(undefined1 *)Operand = 0xc1;
    (Operand->Info).Immediate.Imm = 0x80000000c;
    (Operand->Info).Register.Reg = 0xc0000084;
    break;
  case 0x65:
    *(undefined1 *)Operand = 0xc1;
    (Operand->Info).Immediate.Imm = 0x80000000c;
    (Operand->Info).Register.Reg = 0xc0000100;
    break;
  case 0x66:
    *(undefined1 *)Operand = 0xc1;
    (Operand->Info).Immediate.Imm = 0x80000000c;
    (Operand->Info).Register.Reg = 0xc0000101;
    break;
  case 0x67:
    *(undefined1 *)Operand = 0xc1;
    (Operand->Info).Immediate.Imm = 0x80000000c;
    (Operand->Info).Register.Reg = 0xc0000102;
    break;
  case 0x68:
    *(undefined1 *)Operand = 0xc1;
    NVar24 = 0x80000000d;
LAB_0015d070:
    (Operand->Info).Immediate.Imm = NVar24;
LAB_0015d075:
    (Operand->Info).Register.Reg = 0;
    break;
  case 0x69:
    if ((Instrux->Instruction == ND_INS_PUSHA) || (Instrux->Instruction == ND_INS_POPA)) {
      *(undefined1 *)Operand = 0xc1;
      uVar26 = *(uint *)&Instrux->field_0xc & 0xf;
      Operand->Size = uVar26;
      (Operand->Info).Register.Type = ND_REG_GPR;
      (Operand->Info).Register.Size = uVar26;
      (Operand->Info).Register.Reg = 0;
      (Operand->Info).Register.Count = '\b';
      pbVar2 = (byte *)((long)&Operand->Info + 0xd);
      *pbVar2 = *pbVar2 | 2;
    }
    else {
      *(undefined1 *)Operand = 200;
    }
  }
  bVar29 = *(byte *)Operand;
  if ((bVar29 & 0xf) == 1) {
    NVar10 = (ND_UINT8)(uVar5 >> 0x28);
    uVar26 = (uint)(uVar5 >> 0x28) & 0xff;
    if (uVar26 == 0) {
      NVar10 = '\x01';
    }
    else {
      pNVar3 = &(Operand->Info).Register.Reg;
      *pNVar3 = *pNVar3 & -uVar26;
      pbVar2 = (byte *)((long)&Operand->Info + 0xd);
      *pbVar2 = *pbVar2 | 2;
    }
    (Operand->Info).Register.Count = NVar10;
    if ((((Instrux->field_0x8 & 0x28) != 0) && (((Operand->Access).Access & 2) != 0)) &&
       (((Operand->Flags).Flags & 1) == 0)) {
      pbVar2 = (byte *)((long)&Operand->Info + 0xd);
      *pbVar2 = *pbVar2 | 4;
    }
  }
  if (local_50 != '\0') {
    if (((uVar21 & 1) != 0) && ((Instrux->field_0x7 & 0x80) != 0)) {
      Operand->Decorator =
           (ND_OPERAND_DECORATOR)
           (((byte)Operand->Decorator & 0xc6 | (byte)((uint)Instrux->Exs >> 0x14) & 0x38) + 1);
    }
    if (((uVar21 & 2) != 0) && ((Instrux->field_0x8 & 1) != 0)) {
      if ((bVar29 & 0xf) == 2) {
        return 0x80000037;
      }
      Operand->Decorator = (ND_OPERAND_DECORATOR)((byte)Operand->Decorator | 2);
    }
    if (((uVar21 & 0x4c) != 0) && ((Instrux->field_0x7 & 0x40) != 0)) {
      Operand->Decorator = (ND_OPERAND_DECORATOR)((byte)Operand->Decorator | 4);
    }
  }
  uVar37 = uVar37 + 1;
  if (((byte)Instrux->field_0x39 & 0xf) <= uVar37) {
LAB_0015d36d:
    if ((Instrux->field_0x2 & 0xf) == 0) {
      NVar15 = NdLegacyPrefixChecks(Instrux);
    }
    else {
      NVar15 = NdVexExceptionChecks(Instrux);
    }
    if (-1 < (int)NVar15) {
      return 0;
    }
    return NVar15;
  }
  goto LAB_0015b994;
}

Assistant:

NDSTATUS
NdDecodeWithContext(
    INSTRUX *Instrux,
    const ND_UINT8 *Code,
    ND_SIZET Size,
    ND_CONTEXT *Context
    )
{
    NDSTATUS status;
    PND_IDBE pIns;
    ND_UINT32 opIndex;

    // pre-init
    status = ND_STATUS_SUCCESS;
    pIns = (PND_IDBE)ND_NULL;
    opIndex = 0;

    // validate
    if (ND_NULL == Instrux)
    {
        return ND_STATUS_INVALID_PARAMETER;
    }

    if (ND_NULL == Code)
    {
        return ND_STATUS_INVALID_PARAMETER;
    }

    if (Size == 0)
    {
        return ND_STATUS_INVALID_PARAMETER;
    }

    if (ND_NULL == Context)
    {
        return ND_STATUS_INVALID_PARAMETER;
    }

    if (ND_CODE_64 < Context->DefCode)
    {
        return ND_STATUS_INVALID_PARAMETER;
    }

    if (ND_DATA_64 < Context->DefData)
    {
        return ND_STATUS_INVALID_PARAMETER;
    }

    if (ND_VEND_MAX < Context->VendMode)
    {
        return ND_STATUS_INVALID_PARAMETER;
    }

    if (0 == (Context->Options & ND_OPTION_SKIP_ZERO_INSTRUX))
    {
        // Initialize with zero.
        nd_memzero(Instrux, sizeof(INSTRUX));
    }

    Instrux->DefCode = (ND_UINT8)Context->DefCode;
    Instrux->DefData = (ND_UINT8)Context->DefData;
    Instrux->DefStack = (ND_UINT8)Context->DefStack;
    Instrux->VendMode = (ND_UINT8)Context->VendMode;
    Instrux->FeatMode = (ND_UINT8)Context->FeatMode;
    Instrux->EncMode = ND_ENCM_LEGACY;  // Assume legacy encoding by default.

    // Fetch the instruction bytes.
    for (opIndex = 0; 
         opIndex < ((Size < ND_MAX_INSTRUCTION_LENGTH) ? Size : ND_MAX_INSTRUCTION_LENGTH); 
         opIndex++)
    {
        Instrux->InstructionBytes[opIndex] = Code[opIndex];
    }

    if (gPrefixesMap[Instrux->InstructionBytes[0]] != ND_PREF_CODE_NONE)
    {
        // Fetch prefixes. We peek at the first byte, to see if it's worth calling the prefix decoder.
        status = NdFetchPrefixes(Instrux, Instrux->InstructionBytes, 0, Size);
        if (!ND_SUCCESS(status))
        {
            return status;
        }
    }

    // Get addressing mode & operand size.
    status = NdGetAddrAndOpMode(Instrux);
    if (!ND_SUCCESS(status))
    {
        return status;
    }

    // Start iterating the tables, in order to extract the instruction entry.
    status = NdFindInstruction(Instrux, Instrux->InstructionBytes, Size, &pIns);
    if (!ND_SUCCESS(status))
    {
        return status;
    }

    // Copy information inside the Instrux.
    status = NdCopyInstructionInfo(Instrux, pIns);
    if (!ND_SUCCESS(status))
    {
        return status;
    }

    // Get effective operand mode.
    status = NdGetEffectiveAddrAndOpMode(Instrux);
    if (!ND_SUCCESS(status))
    {
        return status;
    }

    if (Instrux->HasEvex)
    {
        // Post-process EVEX encoded instructions. This does two thing:
        // - check and fill in decorator info;
        // - generate error for invalid broadcast/rounding, mask or zeroing bits;
        // - generate error if any reserved bits are set.
        status = NdGetEvexFields(Instrux);
        if (!ND_SUCCESS(status))
        {
            return status;
        }
    }

    if (ND_HAS_VECTOR(Instrux))
    {
        // Get vector length.
        status = NdGetVectorLength(Instrux);
        if (!ND_SUCCESS(status))
        {
            return status;
        }
    }

    Instrux->ExpOperandsCount = ND_EXP_OPS_CNT(pIns->OpsCount);
    Instrux->OperandsCount = Instrux->ExpOperandsCount;

    if (!(Context->Options & ND_OPTION_ONLY_EXPLICIT_OPERANDS))
    {
        Instrux->OperandsCount += ND_IMP_OPS_CNT(pIns->OpsCount);
    }

    // And now decode each operand.
    for (opIndex = 0; opIndex < Instrux->OperandsCount; ++opIndex)
    {
        status = NdParseOperand(Instrux, Instrux->InstructionBytes, Instrux->Length, Size, 
                                opIndex, pIns->Operands[opIndex]);
        if (!ND_SUCCESS(status))
        {
            return status;
        }
    }

    if (ND_ENCM_LEGACY == Instrux->EncMode)
    {
        // Do legacy prefix checks. Only available for legacy instructions. For XOP/VEX/EVEX instructions:
        // 1. LOCK, REP, 0x66, REX, REX2 cause #UD (checkd during XOP/VEX/EVEX fetch)
        // 2. Segment prefixes do not have BHINT or DNT semantic
        // 3. 0x67 can be used to override address mode
        // This has to be done after operand parsing, since some #UD conditions depend on them.
        status = NdLegacyPrefixChecks(Instrux);
        if (!ND_SUCCESS(status))
        {
            return status;
        }
    }
    else
    {
        // Do XOP/VEX/EVEX encoding checks. Additional #UD conditions, some dependent on encoded registers.
        // This has to be done after operand parsing, since some #UD conditions depend on them.
        status = NdVexExceptionChecks(Instrux);
        if (!ND_SUCCESS(status))
        {
            return status;
        }
    }

    // All done! Instruction successfully decoded!
    return ND_STATUS_SUCCESS;
}